

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_remove_handle(Curl_multi *multi,Curl_easy *data)

{
  CURLMstate CVar1;
  long conn_id;
  _Bool _Var2;
  curl_socket_t cVar3;
  CURLMcode CVar4;
  Curl_llist_node *n;
  void *pvVar5;
  connectdata *c;
  connectdata *local_28;
  
  CVar4 = CURLM_BAD_HANDLE;
  if (multi != (Curl_multi *)0x0) {
    local_28 = (connectdata *)0x1;
    if ((((multi->magic == 0xbab1e) && (CVar4 = CURLM_BAD_EASY_HANDLE, data != (Curl_easy *)0x0)) &&
        (data->magic == 0xc0dedbad)) && (multi->num_easy != 0)) {
      if (data->multi != (Curl_multi *)0x0) {
        if (data->multi != multi) {
          return CURLM_BAD_EASY_HANDLE;
        }
        if ((multi->field_0x279 & 4) != 0) {
          return CURLM_RECURSIVE_API_CALL;
        }
        CVar1 = data->mstate;
        if (CVar1 < MSTATE_COMPLETED) {
          multi->num_alive = multi->num_alive - 1;
        }
        if (CVar1 - MSTATE_DOING < 6 && data->conn != (connectdata *)0x0) {
          Curl_conncontrol(data->conn,2);
        }
        if (data->conn != (connectdata *)0x0) {
          multi_done(data,data->result,CVar1 < MSTATE_COMPLETED);
        }
        _Var2 = Curl_expire_clear(data);
        Curl_node_remove(&data->multi_queue);
        if ((data->dns).hostcachetype == HCACHE_MULTI) {
          (data->dns).hostcache = (Curl_hash *)0x0;
          (data->dns).hostcachetype = HCACHE_NONE;
        }
        Curl_wildcard_dtor(&data->wildcard);
        data->mstate = MSTATE_COMPLETED;
        singlesocket(multi,data);
        Curl_detach_connection(data);
        if ((((data->set).connect_only != '\0') && (data->multi_easy == (Curl_multi *)0x0)) &&
           (cVar3 = Curl_getconnectinfo(data,&local_28),
           local_28 != (connectdata *)0x0 && cVar3 != -1)) {
          Curl_cpool_disconnect(data,local_28,true);
        }
        conn_id = (data->state).lastconnect_id;
        if (conn_id != -1) {
          Curl_cpool_do_by_id(data,conn_id,close_connect_only,(void *)0x0);
        }
        if (data->psl == &multi->psl) {
          data->psl = (PslCache *)0x0;
        }
        for (n = Curl_llist_head(&multi->msglist); n != (Curl_llist_node *)0x0;
            n = Curl_node_next(n)) {
          pvVar5 = Curl_node_elem(n);
          if (*(Curl_easy **)((long)pvVar5 + 0x28) == data) {
            Curl_node_remove(n);
            break;
          }
        }
        data->multi = (Curl_multi *)0x0;
        data->mid = -1;
        multi->num_easy = multi->num_easy - 1;
        process_pending_handles(multi);
        if ((_Var2) && (CVar4 = Curl_update_timer(multi), CVar4 != CURLM_OK)) {
          return CVar4;
        }
      }
      CVar4 = CURLM_OK;
    }
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_remove_handle(struct Curl_multi *multi,
                                   struct Curl_easy *data)
{
  struct Curl_easy *easy = data;
  bool premature;
  struct Curl_llist_node *e;
  CURLMcode rc;
  bool removed_timer = FALSE;

  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data) || !multi->num_easy)
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from trying to remove same easy handle more than once */
  if(!data->multi)
    return CURLM_OK; /* it is already removed so let's say it is fine! */

  /* Prevent users from trying to remove an easy handle from the wrong multi */
  if(data->multi != multi)
    return CURLM_BAD_EASY_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  premature = (data->mstate < MSTATE_COMPLETED) ? TRUE : FALSE;

  /* If the 'state' is not INIT or COMPLETED, we might need to do something
     nice to put the easy_handle in a good known state when this returns. */
  if(premature) {
    /* this handle is "alive" so we need to count down the total number of
       alive connections when this is removed */
    multi->num_alive--;
  }

  if(data->conn &&
     data->mstate > MSTATE_DO &&
     data->mstate < MSTATE_COMPLETED) {
    /* Set connection owner so that the DONE function closes it. We can
       safely do this here since connection is killed. */
    streamclose(data->conn, "Removed with partial response");
  }

  if(data->conn) {
    /* multi_done() clears the association between the easy handle and the
       connection.

       Note that this ignores the return code simply because there is
       nothing really useful to do with it anyway! */
    (void)multi_done(data, data->result, premature);
  }

  /* The timer must be shut down before data->multi is set to NULL, else the
     timenode will remain in the splay tree after curl_easy_cleanup is
     called. Do it after multi_done() in case that sets another time! */
  removed_timer = Curl_expire_clear(data);

  /* the handle is in a list, remove it from whichever it is */
  Curl_node_remove(&data->multi_queue);

  if(data->dns.hostcachetype == HCACHE_MULTI) {
    /* stop using the multi handle's DNS cache, *after* the possible
       multi_done() call above */
    data->dns.hostcache = NULL;
    data->dns.hostcachetype = HCACHE_NONE;
  }

  Curl_wildcard_dtor(&data->wildcard);

  /* change state without using multistate(), only to make singlesocket() do
     what we want */
  data->mstate = MSTATE_COMPLETED;

  /* This ignores the return code even in case of problems because there is
     nothing more to do about that, here */
  (void)singlesocket(multi, easy); /* to let the application know what sockets
                                      that vanish with this handle */

  /* Remove the association between the connection and the handle */
  Curl_detach_connection(data);

  if(data->set.connect_only && !data->multi_easy) {
    /* This removes a handle that was part the multi interface that used
       CONNECT_ONLY, that connection is now left alive but since this handle
       has bits.close set nothing can use that transfer anymore and it is
       forbidden from reuse. This easy handle cannot find the connection
       anymore once removed from the multi handle

       Better close the connection here, at once.
    */
    struct connectdata *c;
    curl_socket_t s;
    s = Curl_getconnectinfo(data, &c);
    if((s != CURL_SOCKET_BAD) && c) {
      Curl_cpool_disconnect(data, c, TRUE);
    }
  }

  if(data->state.lastconnect_id != -1) {
    /* Mark any connect-only connection for closure */
    Curl_cpool_do_by_id(data, data->state.lastconnect_id,
                            close_connect_only, NULL);
  }

#ifdef USE_LIBPSL
  /* Remove the PSL association. */
  if(data->psl == &multi->psl)
    data->psl = NULL;
#endif

  /* make sure there is no pending message in the queue sent from this easy
     handle */
  for(e = Curl_llist_head(&multi->msglist); e; e = Curl_node_next(e)) {
    struct Curl_message *msg = Curl_node_elem(e);

    if(msg->extmsg.easy_handle == easy) {
      Curl_node_remove(e);
      /* there can only be one from this specific handle */
      break;
    }
  }

  data->multi = NULL; /* clear the association to this multi handle */
  data->mid = -1;

  /* NOTE NOTE NOTE
     We do not touch the easy handle here! */
  multi->num_easy--; /* one less to care about now */
  process_pending_handles(multi);

  if(removed_timer) {
    rc = Curl_update_timer(multi);
    if(rc)
      return rc;
  }
  return CURLM_OK;
}